

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::ImageFeatureType::SharedCtor(ImageFeatureType *this)

{
  ImageFeatureType *this_local;
  
  memset(&this->width_,0,0x14);
  clear_has_SizeFlexibility(this);
  this->_cached_size_ = 0;
  return;
}

Assistant:

void ImageFeatureType::SharedCtor() {
  ::memset(&width_, 0, reinterpret_cast<char*>(&colorspace_) -
    reinterpret_cast<char*>(&width_) + sizeof(colorspace_));
  clear_has_SizeFlexibility();
  _cached_size_ = 0;
}